

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPNABase::Mix6(OPNABase *this,Sample *buffer,int nsamples,int activech)

{
  short *psVar1;
  ISample IVar2;
  int iVar3;
  int iVar4;
  uint c;
  int iVar5;
  Channel4 *pCVar6;
  long lVar7;
  ISample out [6];
  ISample aIStack_48 [6];
  
  psVar1 = buffer + nsamples * 2;
  for (; buffer < psVar1; buffer = buffer + 2) {
    if ((activech & 0xaaaU) == 0) {
      pCVar6 = (Channel4 *)&this->field_0x280;
      for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
        if ((*(uint *)((long)&DAT_001de430 + lVar7) & activech) == 0) {
          IVar2 = 0;
        }
        else {
          IVar2 = Channel4::Calc(pCVar6);
        }
        *(ISample *)((long)aIStack_48 + lVar7) = IVar2;
        pCVar6 = pCVar6 + 1;
      }
    }
    else {
      LFO(this);
      pCVar6 = (Channel4 *)&this->field_0x280;
      for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
        if ((*(uint *)((long)&DAT_001de430 + lVar7) & activech) == 0) {
          IVar2 = 0;
        }
        else {
          IVar2 = Channel4::CalcL(pCVar6);
        }
        *(ISample *)((long)aIStack_48 + lVar7) = IVar2;
        pCVar6 = pCVar6 + 1;
      }
    }
    iVar3 = 0;
    iVar5 = 0;
    for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
      iVar3 = iVar3 + (int)(((int)((uint)this->pan[lVar7] << 0x1e) >> 0x1f &
                            (uint)this->panvolume_l[lVar7]) * aIStack_48[lVar7]) / 0xffff;
      iVar5 = iVar5 + (int)((-(this->pan[lVar7] & 1) & (uint)this->panvolume_r[lVar7]) *
                           aIStack_48[lVar7]) / 0xffff;
    }
    iVar4 = iVar3 + *buffer;
    if (iVar3 + *buffer < -0x7fff) {
      iVar4 = -0x8000;
    }
    if (0x7ffe < iVar4) {
      iVar4 = 0x7fff;
    }
    *buffer = (short)iVar4;
    iVar5 = iVar5 + buffer[1];
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    buffer[1] = (short)iVar5;
  }
  return;
}

Assistant:

void OPNABase::Mix6(Sample* buffer, int nsamples, int activech)
{
	// Mix
	// libOPNMIDI: rewrite for panning support

	const uint activechmask[6] = {0x001, 0x004, 0x010, 0x040, 0x100, 0x400};

	Sample* limit = buffer + nsamples * 2;
	for (Sample* dest = buffer; dest < limit; dest+=2)
	{
		ISample out[6];
		if (activech & 0xaaa)
		{
			LFO();
			for (uint c = 0; c<6; ++c)
				out[c] = (activechmask[c] & activech) ? ch[c].CalcL() : 0;
		}
		else
		{
			for (uint c = 0; c<6; ++c)
				out[c] = (activechmask[c] & activech) ? ch[c].Calc() : 0;
		}

		int lrouts[2] = {0, 0};
		for (uint c = 0; c<6; ++c)
		{
			int panl = panvolume_l[c];
			int panr = panvolume_r[c];
			panl = (pan[c] & 2) ? panl : 0;
			panr = (pan[c] & 1) ? panr : 0;
			lrouts[0] += out[c] * panl / 65535;
			lrouts[1] += out[c] * panr / 65535;
		}

		StoreSample(dest[0], lrouts[0]);
		StoreSample(dest[1], lrouts[1]);
	}
}